

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

int __thiscall baryonyx::itm::shared_subvector::init(shared_subvector *this,EVP_PKEY_CTX *ctx)

{
  undefined4 extraout_EAX;
  uint uVar1;
  
  uVar1 = (uint)ctx;
  if (uVar1 != 0) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->m_container,0);
    this->m_element_size = uVar1;
    this->m_free_list_head = 0xffffffff;
    return CONCAT31((int3)((uint)extraout_EAX >> 8),3 < uVar1);
  }
  details::fail_fast("Assertion","element_size > 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                     ,"77");
}

Assistant:

[[nodiscard]] bool init(size_type element_size) noexcept
    {
        bx_assert(element_size > 0);

        m_container.resize(0);
        m_element_size = element_size;
        m_free_list_head = npos;

        if (sizeof(size_type) > (element_size * sizeof(value_type)))
            return false;

        return true;
    }